

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_1::FillRuleCase::FillRuleCase
          (FillRuleCase *this,Context *ctx,char *name,char *desc,FillRuleCaseType type,
          RenderTarget renderTarget,int numSamples)

{
  int iVar1;
  RenderTarget renderTarget_local;
  FillRuleCaseType type_local;
  char *desc_local;
  char *name_local;
  Context *ctx_local;
  FillRuleCase *this_local;
  
  (this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FillRuleCase_015927b8;
  iVar1 = getRenderSize(this,type);
  BaseRenderingCase::BaseRenderingCase
            (&this->super_BaseRenderingCase,ctx,name,desc,renderTarget,numSamples,iVar1);
  (this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FillRuleCase_015927b8;
  *(FillRuleCaseType *)&(this->super_BaseRenderingCase).field_0xc4 = type;
  this->m_iteration = 0;
  iVar1 = getNumIterations(this,type);
  this->m_iterationCount = iVar1;
  this->m_allIterationsPassed = true;
  return;
}

Assistant:

FillRuleCase::FillRuleCase (Context& ctx, const char* name, const char* desc, FillRuleCaseType type, RenderTarget renderTarget, int numSamples)
	: BaseRenderingCase		(ctx, name, desc, renderTarget, numSamples, getRenderSize(type))
	, m_caseType			(type)
	, m_iteration			(0)
	, m_iterationCount		(getNumIterations(type))
	, m_allIterationsPassed	(true)
{
	DE_ASSERT(type < FILLRULECASE_LAST);
}